

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O2

void __thiscall tonk::Connection::tonk_status(Connection *this,TonkStatus *statusOut)

{
  byte *pbVar1;
  uint uVar2;
  
  statusOut->Flags = 0;
  if (((this->TimeSync).Synchronized._M_base._M_i & 1U) != 0) {
    *(byte *)&statusOut->Flags = (byte)statusOut->Flags | 1;
  }
  if (this->LocalNATMapExternalPort != 0) {
    pbVar1 = (byte *)((long)&statusOut->Flags + 1);
    *pbVar1 = *pbVar1 | 1;
  }
  if (this->RemoteNATMapExternalPort != 0) {
    pbVar1 = (byte *)((long)&statusOut->Flags + 1);
    *pbVar1 = *pbVar1 | 2;
  }
  if ((this->ResolverState)._M_t.
      super___uniq_ptr_impl<tonk::HostnameResolverState,_std::default_delete<tonk::HostnameResolverState>_>
      ._M_t.
      super__Tuple_impl<0UL,_tonk::HostnameResolverState_*,_std::default_delete<tonk::HostnameResolverState>_>
      .super__Head_base<0UL,_tonk::HostnameResolverState_*,_false>._M_head_impl !=
      (HostnameResolverState *)0x0) {
    pbVar1 = (byte *)((long)&statusOut->Flags + 3);
    *pbVar1 = *pbVar1 | 0x10;
  }
  if (((this->super_IConnection).SelfRefCount.Shutdown._M_base._M_i & 1U) == 0) {
    if (((this->ConnectionEstablished)._M_base._M_i & 1U) == 0) {
      uVar2 = statusOut->Flags | 0x1000000;
    }
    else {
      uVar2 = statusOut->Flags | 0x2000000;
    }
  }
  else {
    uVar2 = statusOut->Flags | 0x4000000;
  }
  statusOut->Flags = uVar2;
  SessionOutgoing::tonk_status(&this->Outgoing,statusOut);
  statusOut->LocallyAssignedIdForRemoteHost = this->LocallyAssignedIdForRemoteHost;
  statusOut->TimerIntervalUsec = this->SocketConfig->TimerIntervalUsec;
  return;
}

Assistant:

void Connection::tonk_status(TonkStatus& statusOut)
{
    // WARNING: This function is not called on the Connection green thread,
    // so accessing members here is not threadsafe by default.

    TONK_DEBUG_ASSERT(SelfRefCount.DoesAppHoldReference());

    statusOut.Flags = 0;

    if (TimeSync.IsSynchronized()) {
        statusOut.Flags |= TonkFlag_TimeSync;
    }

    if (LocalNATMapExternalPort != 0) {
        statusOut.Flags |= TonkFlag_NATMap_Local;
    }
    if (RemoteNATMapExternalPort != 0) {
        statusOut.Flags |= TonkFlag_NATMap_Remote;
    }

    if (ResolverState) { // Set during Initialize() - safe here
        statusOut.Flags |= TonkFlag_Initiated;
    }

    if (SelfRefCount.IsShutdown()) {
        statusOut.Flags |= TonkFlag_Disconnected;
    }
    else if (ConnectionEstablished) {
        statusOut.Flags |= TonkFlag_Connected;
    }
    else {
        statusOut.Flags |= TonkFlag_Connecting;
    }

    Outgoing.tonk_status(statusOut);

    // This Id is assigned on Connection initialization and is safe to read
    statusOut.LocallyAssignedIdForRemoteHost = LocallyAssignedIdForRemoteHost;

    statusOut.TimerIntervalUsec = SocketConfig->TimerIntervalUsec;
}